

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testprog.h
# Opt level: O0

void create_context_from_file(xm_context_t **ctx,uint32_t rate,char *filename)

{
  int __fd;
  int iVar1;
  size_t __len;
  void *__addr;
  char *in_RDX;
  uint32_t in_ESI;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  char *data;
  off_t size;
  int xmfiledes;
  
  __fd = open(in_RDX,0);
  if (__fd == -1) {
    perror("Could not open input file");
    fflush(_stderr);
    *in_RDI = 0;
  }
  else {
    __len = lseek(__fd,0,2);
    if (__len == 0xffffffffffffffff) {
      close(__fd);
      perror("lseek() failed");
      fflush(_stderr);
      *in_RDI = 0;
    }
    else {
      __addr = mmap((void *)0x0,__len,1,1,__fd,0);
      if (__addr == (void *)0xffffffffffffffff) {
        perror("mmap() failed");
        fflush(_stderr);
        exit(1);
      }
      iVar1 = xm_create_context_safe((xm_context_t **)data,unaff_retaddr,(size_t)in_RDI,in_ESI);
      if (iVar1 != 0) {
        if (iVar1 != 1) {
          if (iVar1 == 2) {
            fprintf(_stderr,"could not create context: malloc failed\n");
            fflush(_stderr);
            exit(1);
          }
          fprintf(_stderr,"could not create context: unknown error\n");
          fflush(_stderr);
          exit(1);
        }
        fprintf(_stderr,"could not create context: module is not sane\n");
        fflush(_stderr);
        *in_RDI = 0;
      }
      munmap(__addr,__len);
      close(__fd);
    }
  }
  return;
}

Assistant:

static void create_context_from_file(xm_context_t** ctx, uint32_t rate, const char* filename) {
	int xmfiledes;
	off_t size;

	xmfiledes = open(filename, O_RDONLY);
	if(xmfiledes == -1) {
		DEBUG_ERR("Could not open input file");
		*ctx = NULL;
		return;
	}

	size = lseek(xmfiledes, 0, SEEK_END);
	if(size == -1) {
		close(xmfiledes);
		DEBUG_ERR("lseek() failed");
		*ctx = NULL;
		return;
	}

	/* NB: using a VLA here was a bad idea, as the size of the
	 * module file has no upper bound, whereas the stack has a
	 * very finite (and usually small) size. Using mmap bypasses
	 * the issue (at the cost of portability…). */
	char* data = mmap(NULL, size, PROT_READ, MAP_SHARED, xmfiledes, (off_t)0);
	if(data == MAP_FAILED)
		FATAL_ERR("mmap() failed");

	switch(xm_create_context_safe(ctx, data, size, rate)) {
		
	case 0:
		break;

	case 1:
		DEBUG("could not create context: module is not sane\n");
		*ctx = NULL;
		break;

	case 2:
		FATAL("could not create context: malloc failed\n");
		break;
		
	default:
		FATAL("could not create context: unknown error\n");
		break;
		
	}
	
	munmap(data, size);
	close(xmfiledes);
}